

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaValidator::faultInAttr(SchemaValidator *this,XMLAttr *toFill,XMLAttDef *attDef)

{
  long lVar1;
  
  lVar1 = *(long *)&attDef[1].fCreateReason;
  XMLAttr::set(toFill,*(uint *)(lVar1 + 0x20),*(XMLCh **)(lVar1 + 0x30),*(XMLCh **)(lVar1 + 0x28),
               attDef->fValue,attDef->fType,(DatatypeValidator *)0x0,false);
  return;
}

Assistant:

void SchemaValidator::faultInAttr (XMLAttr&    toFill, const XMLAttDef&  attDef)   const
{
    //
    //  At this level, we cannot set the URI id. So we just set it to zero
    //  and leave it at that. The scanner, who called us, will look at the
    //  prefix we stored (if any), resolve it, and store the URL id if any.
    //
    SchemaAttDef* schemaAttDef = (SchemaAttDef*) &attDef;
    QName* attName = schemaAttDef->getAttName();

    toFill.set
    (
          attName->getURI()
        , attName->getLocalPart()
        , attName->getPrefix()
        , schemaAttDef->getValue()
        , schemaAttDef->getType()
    );
}